

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O2

void __thiscall
embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleMv<4>_>::RefBuilderSmall
::attachBuildRefs(RefBuilderSmall *this,
                 BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *topBuilder)

{
  FastAllocator *this_00;
  long *plVar1;
  atomic<int> *paVar2;
  undefined4 *puVar3;
  BuildRef *pBVar4;
  Vec3fx *pVVar5;
  int iVar6;
  uint uVar7;
  float fVar8;
  Geometry *pGVar9;
  BVH *pBVar10;
  MutexSys *pMVar11;
  Scene *pSVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  BuildRef *pBVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined8 uVar25;
  MutexSys *this_01;
  ulong uVar26;
  undefined8 *puVar27;
  long lVar28;
  ulong uVar29;
  float *pfVar30;
  ulong uVar31;
  long lVar32;
  size_t sVar33;
  ulong uVar34;
  vuint<4> vgeomID;
  Lock<embree::MutexSys> lock;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  PrimRef *local_110;
  RefBuilderSmall *local_108;
  long *local_100;
  Lock<embree::MutexSys> local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  vuint<4> vprimID;
  PrimInfo pinfo;
  
  sVar33 = this->objectID_;
  pGVar9 = (topBuilder->scene->geometries).items[sVar33].ptr;
  uVar7 = pGVar9->numPrimitives;
  uVar34 = CONCAT44(0,uVar7);
  lVar28 = *(long *)&(topBuilder->scene->super_AccelN).field_0x188;
  local_130._0_8_ = lVar28 + 0x550;
  if (lVar28 == 0) {
    local_130._0_8_ = (MemoryMonitorInterface *)0x0;
  }
  local_110 = (PrimRef *)0x0;
  local_130[8] = false;
  local_120 = (undefined1  [16])0x0;
  local_108 = this;
  if (uVar34 != 0) {
    sVar33 = uVar34 << 5;
    (**((MemoryMonitorInterface *)local_130._0_8_)->_vptr_MemoryMonitorInterface)
              (local_130._0_8_,sVar33,0);
    if (uVar7 < 0xe0000) {
      local_110 = (PrimRef *)alignedMalloc(sVar33,0x20);
    }
    else {
      local_110 = (PrimRef *)os_malloc(sVar33,(bool *)(local_130 + 8));
    }
    local_120._8_4_ = uVar7;
    local_120._0_8_ = uVar34;
    local_120._12_4_ = 0;
    sVar33 = local_108->objectID_;
  }
  sse2::createPrimRefArray
            (&pinfo,pGVar9,(uint)sVar33,uVar34,(mvector<PrimRef> *)local_130,
             &(topBuilder->bvh->scene->progressInterface).super_BuildProgressMonitor);
  local_100 = (long *)__tls_get_addr(&PTR_021f8d38);
  uVar34 = 0;
  do {
    if (pinfo.end - pinfo.begin <= uVar34) {
      uVar25 = local_120._8_8_;
      if (local_110 != (PrimRef *)0x0) {
        if ((ulong)(local_120._8_8_ << 5) < 0x1c00000) {
          alignedFree(local_110);
        }
        else {
          os_free(local_110,local_120._8_8_ << 5,local_130[8]);
        }
      }
      if (uVar25 != 0) {
        (***(_func_int ***)local_130._0_8_)(local_130._0_8_,uVar25 * -0x20,1);
      }
      return;
    }
    pBVar10 = topBuilder->bvh;
    this_01 = (MutexSys *)*local_100;
    if (this_01 == (MutexSys *)0x0) {
      this_01 = (MutexSys *)FastAllocator::ThreadLocal2::operator_new(0xc0);
      MutexSys::MutexSys(this_01);
      this_01[1].mutex = (void *)0x0;
      this_01[8].mutex = this_01;
      *(undefined1 (*) [16])(this_01 + 9) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(this_01 + 0xb) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(this_01 + 0xd) = (undefined1  [16])0x0;
      this_01[0x10].mutex = this_01;
      *(undefined1 (*) [16])(this_01 + 0x11) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(this_01 + 0x13) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(this_01 + 0x15) = (undefined1  [16])0x0;
      *local_100 = (long)this_01;
      lock.locked = true;
      lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      local_f8.mutex = this_01;
      std::
      vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
      ::
      emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                  *)FastAllocator::s_thread_local_allocators,
                 (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  *)&local_f8);
      std::
      unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
      ::~unique_ptr((unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     *)&local_f8);
      Lock<embree::MutexSys>::~Lock(&lock);
    }
    this_00 = &pBVar10->alloc;
    uVar31 = (ulong)(((pBVar10->alloc).use_single_mode ^ 1) << 6);
    vgeomID.field_0.v[0] = 0xb0;
    pMVar11 = *(MutexSys **)((long)&this_01[8].mutex + uVar31);
    if (this_00 != (FastAllocator *)pMVar11[1].mutex) {
      local_f8.locked = true;
      local_f8.mutex = pMVar11;
      MutexSys::lock(pMVar11);
      if (pMVar11[1].mutex != (void *)0x0) {
        LOCK();
        plVar1 = (long *)((long)pMVar11[1].mutex + 0x118);
        *plVar1 = *plVar1 + (long)pMVar11[0x15].mutex + (long)pMVar11[0xd].mutex;
        UNLOCK();
        LOCK();
        plVar1 = (long *)((long)pMVar11[1].mutex + 0x120);
        *plVar1 = *plVar1 + (((long)pMVar11[0xb].mutex + (long)pMVar11[0x13].mutex) -
                            ((long)pMVar11[10].mutex + (long)pMVar11[0x12].mutex));
        UNLOCK();
        LOCK();
        plVar1 = (long *)((long)pMVar11[1].mutex + 0x128);
        *plVar1 = *plVar1 + (long)pMVar11[0x16].mutex + (long)pMVar11[0xe].mutex;
        UNLOCK();
      }
      *(undefined1 (*) [16])(pMVar11 + 0xd) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(pMVar11 + 0xb) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(pMVar11 + 9) = (undefined1  [16])0x0;
      pMVar11[0xc].mutex = (void *)(pBVar10->alloc).defaultBlockSize;
      *(undefined1 (*) [16])(pMVar11 + 0x11) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(pMVar11 + 0x13) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(pMVar11 + 0x15) = (undefined1  [16])0x0;
      pMVar11[0x14].mutex = (void *)(pBVar10->alloc).defaultBlockSize;
      LOCK();
      pMVar11[1].mutex = this_00;
      UNLOCK();
      local_c8._0_8_ = pMVar11;
      lock.locked = true;
      lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(pBVar10->alloc).thread_local_allocators,(value_type *)local_c8);
      Lock<embree::MutexSys>::~Lock(&lock);
      Lock<embree::MutexSys>::~Lock(&local_f8);
    }
    plVar1 = (long *)((long)&this_01[0xd].mutex + uVar31);
    *plVar1 = *plVar1 + vgeomID.field_0.v[0];
    lVar28 = *(long *)((long)&this_01[10].mutex + uVar31);
    uVar29 = (ulong)(-(int)lVar28 & 0xf);
    uVar26 = lVar28 + vgeomID.field_0.v[0] + uVar29;
    *(ulong *)((long)&this_01[10].mutex + uVar31) = uVar26;
    if (*(ulong *)((long)&this_01[0xb].mutex + uVar31) < uVar26) {
      *(long *)((long)&this_01[10].mutex + uVar31) = lVar28;
      pMVar11 = *(MutexSys **)((long)&this_01[0xc].mutex + uVar31);
      if (pMVar11 < (MutexSys *)(vgeomID.field_0.v[0] << 2)) {
        puVar27 = (undefined8 *)FastAllocator::malloc(this_00,(size_t)&vgeomID);
      }
      else {
        lock.mutex = pMVar11;
        puVar27 = (undefined8 *)FastAllocator::malloc(this_00,(size_t)&lock);
        *(undefined8 **)((long)&this_01[9].mutex + uVar31) = puVar27;
        lVar28 = (*(long *)((long)&this_01[0xb].mutex + uVar31) -
                 *(long *)((long)&this_01[10].mutex + uVar31)) +
                 *(long *)((long)&this_01[0xe].mutex + uVar31);
        *(long *)((long)&this_01[0xe].mutex + uVar31) = lVar28;
        *(undefined8 *)((long)&this_01[10].mutex + uVar31) = 0;
        *(MutexSys **)((long)&this_01[0xb].mutex + uVar31) = lock.mutex;
        *(longlong *)((long)&this_01[10].mutex + uVar31) = vgeomID.field_0.v[0];
        if (lock.mutex < (ulong)vgeomID.field_0.v[0]) {
          *(undefined8 *)((long)&this_01[10].mutex + uVar31) = 0;
          lock.mutex = *(MutexSys **)((long)&this_01[0xc].mutex + uVar31);
          puVar27 = (undefined8 *)FastAllocator::malloc(this_00,(size_t)&lock);
          *(undefined8 **)((long)&this_01[9].mutex + uVar31) = puVar27;
          lVar28 = (*(long *)((long)&this_01[0xb].mutex + uVar31) -
                   *(long *)((long)&this_01[10].mutex + uVar31)) +
                   *(long *)((long)&this_01[0xe].mutex + uVar31);
          *(long *)((long)&this_01[0xe].mutex + uVar31) = lVar28;
          *(undefined8 *)((long)&this_01[10].mutex + uVar31) = 0;
          *(MutexSys **)((long)&this_01[0xb].mutex + uVar31) = lock.mutex;
          *(longlong *)((long)&this_01[10].mutex + uVar31) = vgeomID.field_0.v[0];
          if (lock.mutex < (ulong)vgeomID.field_0.v[0]) {
            *(undefined8 *)((long)&this_01[10].mutex + uVar31) = 0;
            puVar27 = (undefined8 *)0x0;
            goto LAB_0051a566;
          }
        }
        *(long *)((long)&this_01[0xe].mutex + uVar31) = lVar28;
      }
    }
    else {
      plVar1 = (long *)((long)&this_01[0xe].mutex + uVar31);
      *plVar1 = *plVar1 + uVar29;
      puVar27 = (undefined8 *)
                ((uVar26 - vgeomID.field_0._0_8_) + *(long *)((long)&this_01[9].mutex + uVar31));
    }
LAB_0051a566:
    pSVar12 = topBuilder->bvh->scene;
    vgeomID.field_0.v[0] = -1;
    vgeomID.field_0.i[2] = 0xffffffff;
    vgeomID.field_0.i[3] = 0xffffffff;
    vprimID.field_0.i[0] = 0xffffffff;
    vprimID.field_0.i[1] = 0xffffffff;
    vprimID.field_0.i[2] = 0xffffffff;
    vprimID.field_0.i[3] = 0xffffffff;
    local_148 = (undefined1  [16])0x0;
    local_158 = (undefined1  [16])0x0;
    lock.mutex = (MutexSys *)0x0;
    lock.locked = false;
    lock._9_7_ = 0;
    local_d8 = (undefined1  [16])0x0;
    local_e8 = (undefined1  [16])0x0;
    local_f8.mutex = (MutexSys *)0x0;
    local_f8.locked = false;
    local_f8._9_7_ = 0;
    local_a8 = (undefined1  [16])0x0;
    local_b8 = (undefined1  [16])0x0;
    local_c8 = (undefined1  [16])0x0;
    pfVar30 = local_110[uVar34].upper.field_0.m128 + 3;
    for (uVar31 = 0; (uVar31 < 4 && (uVar34 + uVar31 < pinfo.end - pinfo.begin));
        uVar31 = uVar31 + 1) {
      fVar8 = *pfVar30;
      pGVar9 = (pSVar12->geometries).items[(uint)pfVar30[-4]].ptr;
      lVar32 = (ulong)(uint)fVar8 *
               pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar28 = *(long *)&pGVar9->field_0x58;
      lVar13 = *(long *)&pGVar9[1].time_range.upper;
      p_Var14 = pGVar9[1].intersectionFilterN;
      puVar3 = (undefined4 *)(lVar13 + (ulong)*(uint *)(lVar28 + lVar32) * (long)p_Var14);
      uVar16 = *puVar3;
      uVar17 = puVar3[1];
      uVar18 = puVar3[2];
      puVar3 = (undefined4 *)(lVar13 + (ulong)*(uint *)(lVar28 + 4 + lVar32) * (long)p_Var14);
      uVar19 = *puVar3;
      uVar20 = puVar3[1];
      uVar21 = puVar3[2];
      puVar3 = (undefined4 *)(lVar13 + (ulong)*(uint *)(lVar28 + 8 + lVar32) * (long)p_Var14);
      uVar22 = *puVar3;
      uVar23 = puVar3[1];
      uVar24 = puVar3[2];
      vgeomID.field_0.i[uVar31] = (uint)pfVar30[-4];
      vprimID.field_0.i[uVar31] = (uint)fVar8;
      *(undefined4 *)(local_158 + uVar31 * 4 + -0x10) = uVar16;
      *(undefined4 *)(local_158 + uVar31 * 4) = uVar17;
      *(undefined4 *)(local_148 + uVar31 * 4) = uVar18;
      *(undefined4 *)((long)&local_f8.mutex + uVar31 * 4) = uVar19;
      *(undefined4 *)(local_e8 + uVar31 * 4) = uVar20;
      *(undefined4 *)(local_d8 + uVar31 * 4) = uVar21;
      *(undefined4 *)(local_c8 + uVar31 * 4) = uVar22;
      *(undefined4 *)(local_b8 + uVar31 * 4) = uVar23;
      *(undefined4 *)(local_a8 + uVar31 * 4) = uVar24;
      pfVar30 = pfVar30 + 8;
    }
    *puVar27 = lock.mutex;
    puVar27[1] = lock._8_8_;
    puVar27[2] = local_158._0_8_;
    puVar27[3] = local_158._8_8_;
    puVar27[4] = local_148._0_8_;
    puVar27[5] = local_148._8_8_;
    puVar27[6] = local_f8.mutex;
    puVar27[7] = local_f8._8_8_;
    puVar27[8] = local_e8._0_8_;
    puVar27[9] = local_e8._8_8_;
    puVar27[10] = local_d8._0_8_;
    puVar27[0xb] = local_d8._8_8_;
    puVar27[0xc] = local_c8._0_8_;
    puVar27[0xd] = local_c8._8_8_;
    puVar27[0xe] = local_b8._0_8_;
    puVar27[0xf] = local_b8._8_8_;
    puVar27[0x10] = local_a8._0_8_;
    puVar27[0x11] = local_a8._8_8_;
    puVar27[0x12] = vgeomID.field_0.v[0];
    puVar27[0x13] = CONCAT44(vgeomID.field_0.i[3],vgeomID.field_0.i[2]);
    puVar27[0x14] = CONCAT44(vprimID.field_0.i[1],vprimID.field_0.i[0]);
    puVar27[0x15] = CONCAT44(vprimID.field_0.i[3],vprimID.field_0.i[2]);
    fVar8 = *(float *)&local_108->objectID_;
    LOCK();
    paVar2 = &topBuilder->nextRef;
    iVar6 = (paVar2->super___atomic_base<int>)._M_i;
    (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    pBVar15 = (topBuilder->refs).items;
    pBVar4 = pBVar15 + iVar6;
    (pBVar4->super_PrimRef).lower.field_0.m128[0] =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0.m128[0];
    (pBVar4->super_PrimRef).lower.field_0.m128[1] =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0.m128[1];
    (pBVar4->super_PrimRef).lower.field_0.m128[2] =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0.m128[2];
    (pBVar4->super_PrimRef).lower.field_0.m128[3] = fVar8;
    pVVar5 = &pBVar15[iVar6].super_PrimRef.upper;
    (pVVar5->field_0).m128[0] =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0.m128[0];
    (pVVar5->field_0).m128[1] =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0.m128[1];
    (pVVar5->field_0).m128[2] =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0.m128[2];
    (pVVar5->field_0).m128[3] = 1.4013e-45;
    pBVar15[iVar6].node.ptr = (ulong)puVar27 | 9;
    pBVar15[iVar6].bounds_area = 0.0;
    uVar34 = uVar34 + uVar31;
  } while( true );
}

Assistant:

void attachBuildRefs (BVHNBuilderTwoLevel* topBuilder) {

          Mesh* mesh = topBuilder->scene->template getSafe<Mesh>(objectID_);
          size_t meshSize = mesh->size();
          assert(isSmallGeometry(mesh));
          
          mvector<PrimRef> prefs(topBuilder->scene->device, meshSize);
          auto pinfo = createPrimRefArray(mesh,objectID_,meshSize,prefs,topBuilder->bvh->scene->progressInterface);

          size_t begin=0;
          while (begin < pinfo.size())
          {
            Primitive* accel = (Primitive*) topBuilder->bvh->alloc.getCachedAllocator().malloc1(sizeof(Primitive),BVH::byteAlignment);
            typename BVH::NodeRef node = BVH::encodeLeaf((char*)accel,1);
            accel->fill(prefs.data(),begin,pinfo.size(),topBuilder->bvh->scene);
            
            /* create build primitive */
#if ENABLE_DIRECT_SAH_MERGE_BUILDER
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node,(unsigned int)objectID_,1);
#else
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node);
#endif
          }
          assert(begin == pinfo.size());
        }